

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

void jit_secure_call(lua_State *L,TValue *base,int nres)

{
  TValue *pTVar1;
  GCstr *pGVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(L->glref).ptr32;
  if (*(int *)(uVar3 + 400) == 0) {
    *(byte *)(uVar3 + 0x31c) = *(byte *)(uVar3 + 0x31c) & 0xef;
    lj_vm_call(L);
    return;
  }
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pGVar2 = lj_err_str(L,LJ_ERR_JITCALL);
  (pTVar1->u32).lo = (uint32_t)pGVar2;
  (pTVar1->field_2).it = 0xfffffffb;
  if (*(code **)(uVar3 + 0x178) != (code *)0x0) {
    (**(code **)(uVar3 + 0x178))(L);
  }
  exit(1);
}

Assistant:

static void jit_secure_call(lua_State *L, TValue *base, int nres) {
  global_State *g = G(L);
  /* Forbid Lua world re-entrancy while running the trace */
  if (tvref(g->jit_base)) {
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_JITCALL));
    if (g->panic) g->panic(L);
    exit(EXIT_FAILURE);
  }
  lj_trace_abort(g);  /* Never record across Lua VM entrance */
  lj_vm_call(L, base, nres);
}